

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

void __thiscall testing::internal::MutexBase::Lock(MutexBase *this)

{
  int iVar1;
  ostream *poVar2;
  pthread_t pVar3;
  GTestLog local_1c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x64f);
    poVar2 = std::operator<<((ostream *)&std::cerr,"pthread_mutex_lock(&mutex_)");
    poVar2 = std::operator<<(poVar2,"failed with error ");
    std::ostream::operator<<(poVar2,iVar1);
    GTestLog::~GTestLog(&local_1c);
  }
  pVar3 = pthread_self();
  this->owner_ = pVar3;
  this->has_owner_ = true;
  return;
}

Assistant:

void Lock() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_lock(&mutex_));
    owner_ = pthread_self();
    has_owner_ = true;
  }